

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txindex.cpp
# Opt level: O0

bool __thiscall TxIndex::CustomAppend(TxIndex *this,BlockInfo *block)

{
  bool bVar1;
  long in_RSI;
  DB *in_RDI;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_const_CTransaction> PVar2;
  shared_ptr<const_CTransaction> *tx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_> vPos;
  CDiskTxPos pos;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  CDiskTxPos *in_stack_ffffffffffffff38;
  CTransaction *in_stack_ffffffffffffff40;
  TransactionSerParams *in_stack_ffffffffffffff48;
  vector<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_> *v_pos;
  bool local_59;
  vector<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_> local_38;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RSI + 0x10) == 0) {
    local_59 = true;
  }
  else {
    if (*(long *)(in_RSI + 0x20) == 0) {
      __assert_fail("block.data",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/txindex.cpp"
                    ,0x3e,"virtual bool TxIndex::CustomAppend(const interfaces::BlockInfo &)");
    }
    FlatFilePos::FlatFilePos
              ((FlatFilePos *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),0,
               0xf971df);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    GetSizeOfCompactSize((uint64_t)in_stack_ffffffffffffff40);
    CDiskTxPos::CDiskTxPos
              (in_stack_ffffffffffffff38,
               (FlatFilePos *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
               in_stack_ffffffffffffff2c);
    v_pos = &local_38;
    std::vector<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>::
    vector((vector<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>
            *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::vector<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>::
    reserve((vector<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>
             *)in_RDI,(size_type)v_pos);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
    PVar2.m_object = in_stack_ffffffffffffff40;
    PVar2.m_params = in_stack_ffffffffffffff48;
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                        ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                          *)in_stack_ffffffffffffff38,
                         (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff37,
                                     CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)))
      ;
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
      ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      CTransaction::GetHash
                ((CTransaction *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      std::vector<std::pair<uint256,CDiskTxPos>,std::allocator<std::pair<uint256,CDiskTxPos>>>::
      emplace_back<transaction_identifier<false>const&,CDiskTxPos&>
                ((vector<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>
                  *)PVar2.m_params,(transaction_identifier<false> *)PVar2.m_object,
                 in_stack_ffffffffffffff38);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )in_stack_ffffffffffffff38);
      PVar2 = TransactionSerParams::operator()
                        ((TransactionSerParams *)in_stack_ffffffffffffff38,
                         (CTransaction *)
                         CONCAT17(in_stack_ffffffffffffff37,
                                  CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
      in_stack_ffffffffffffff38 =
           (CDiskTxPos *)
           GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                     ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)
                      CONCAT17(in_stack_ffffffffffffff37,
                               CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
      local_c = local_c + (int)in_stack_ffffffffffffff38;
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
      ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    }
    std::unique_ptr<TxIndex::DB,_std::default_delete<TxIndex::DB>_>::operator->
              ((unique_ptr<TxIndex::DB,_std::default_delete<TxIndex::DB>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_59 = DB::WriteTxs(in_RDI,v_pos);
    std::vector<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>::
    ~vector((vector<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>
             *)in_stack_ffffffffffffff38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_59;
  }
  __stack_chk_fail();
}

Assistant:

bool TxIndex::CustomAppend(const interfaces::BlockInfo& block)
{
    // Exclude genesis block transaction because outputs are not spendable.
    if (block.height == 0) return true;

    assert(block.data);
    CDiskTxPos pos({block.file_number, block.data_pos}, GetSizeOfCompactSize(block.data->vtx.size()));
    std::vector<std::pair<uint256, CDiskTxPos>> vPos;
    vPos.reserve(block.data->vtx.size());
    for (const auto& tx : block.data->vtx) {
        vPos.emplace_back(tx->GetHash(), pos);
        pos.nTxOffset += ::GetSerializeSize(TX_WITH_WITNESS(*tx));
    }
    return m_db->WriteTxs(vPos);
}